

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_1::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  undefined8 in_RAX;
  undefined **ppuVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar1 = &PTR__Context_001ae430;
    *IMutableContext::currentContext = &PTR__Context_001ae430;
    IMutableContext::currentContext[1] = &PTR__Context_001ae480;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar1 = (undefined **)*IMutableContext::currentContext;
  }
  puVar2 = (undefined8 *)(*(code *)ppuVar1[4])();
  poVar3 = (ostream *)(**(code **)(*(long *)*puVar2 + 0x18))();
  uStack_18 = CONCAT17(0x1b,(undefined7)uStack_18);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_18 + 7),1);
  if (this == (PosixColourImpl *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)this,sVar4);
  }
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            getCurrentContext().getConfig()->stream()
                << '\033' << _escapeCode;
        }